

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_geometry_device.cpp
# Opt level: O2

uint embree::createTriangulatedSphere(RTCScene scene,Vec3fa *p,float r)

{
  int iVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float *pfVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int theta;
  float *pfVar16;
  long lVar17;
  float __x;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float phif;
  
  uVar5 = rtcNewGeometry(g_device,0);
  lVar6 = rtcSetNewGeometryBuffer(uVar5,1,0,0x9003,0x10,0x348);
  lVar7 = rtcSetNewGeometryBuffer(uVar5,0,0,0x5003,0xc,0x5f0);
  auVar21._0_12_ = ZEXT812(0x42200000);
  auVar21._12_4_ = 0;
  auVar21 = rcpss(auVar21,ZEXT816(0x42200000));
  auVar22._0_12_ = ZEXT812(0x41a00000);
  auVar22._12_4_ = 0;
  auVar22 = rcpss(auVar22,ZEXT816(0x41a00000));
  pfVar16 = (float *)(lVar6 + 8);
  iVar15 = -0x28;
  iVar10 = 0;
  lVar6 = 0;
  iVar12 = 0;
  do {
    if (lVar6 == 0x15) {
      rtcCommitGeometry(uVar5);
      uVar4 = rtcAttachGeometry(scene,uVar5);
      rtcReleaseGeometry(uVar5);
      return uVar4;
    }
    __x = (float)(int)lVar6 * 3.1415927 * (2.0 - auVar22._0_4_ * 20.0) * auVar22._0_4_;
    iVar3 = (int)lVar6 * 0x28;
    pfVar11 = pfVar16;
    for (lVar17 = 0; lVar17 != 0x28; lVar17 = lVar17 + 1) {
      fVar18 = ((float)(int)lVar17 + (float)(int)lVar17) * 3.1415927 *
               (2.0 - auVar21._0_4_ * 40.0) * auVar21._0_4_;
      fVar2 = (p->field_0).m128[0];
      fVar19 = sinf(__x);
      fVar20 = sinf(fVar18);
      pfVar11[-2] = fVar20 * fVar19 * r + fVar2;
      fVar2 = (p->field_0).m128[1];
      fVar19 = cosf(__x);
      pfVar11[-1] = fVar19 * r + fVar2;
      fVar2 = (p->field_0).m128[2];
      fVar19 = sinf(__x);
      fVar18 = cosf(fVar18);
      *pfVar11 = fVar18 * fVar19 * r + fVar2;
      pfVar11 = pfVar11 + 4;
    }
    if (lVar6 != 0) {
      iVar9 = 0;
LAB_001184d2:
      if (iVar9 != 0x28) {
        iVar8 = iVar9 + 1;
        iVar13 = iVar8;
        if (iVar9 == 0x27) {
          iVar13 = 0;
        }
        iVar1 = iVar13 + iVar3 + -0x28;
        iVar14 = iVar10 + iVar9;
        if (lVar6 != 1) break;
        goto LAB_00118511;
      }
    }
    lVar6 = lVar6 + 1;
    pfVar16 = pfVar16 + 0xa0;
    iVar15 = iVar15 + 0x28;
    iVar10 = iVar10 + 0x28;
  } while( true );
  lVar17 = (long)iVar12 * 0xc;
  iVar12 = iVar12 + 1;
  *(int *)(lVar7 + lVar17) = iVar14;
  *(int *)(lVar7 + 4 + lVar17) = iVar1;
  *(int *)(lVar7 + 8 + lVar17) = iVar9 + iVar15;
  iVar9 = iVar8;
  if (lVar6 != 0x14) {
LAB_00118511:
    lVar17 = (long)iVar12 * 0xc;
    *(int *)(lVar7 + lVar17) = iVar13 + iVar3;
    *(int *)(lVar7 + 4 + lVar17) = iVar1;
    *(int *)(lVar7 + 8 + lVar17) = iVar14;
    iVar12 = iVar12 + 1;
    iVar9 = iVar8;
  }
  goto LAB_001184d2;
}

Assistant:

unsigned int createTriangulatedSphere (RTCScene scene, const Vec3fa& p, float r)
{
  /* create triangle mesh */
  RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_TRIANGLE);

  /* map triangle and vertex buffers */
  Vertex* vertices = (Vertex*) rtcSetNewGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT3, sizeof(Vertex), numTheta*(numPhi+1));
  Triangle* triangles = (Triangle*) rtcSetNewGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX, 0, RTC_FORMAT_UINT3, sizeof(Triangle), 2*numTheta*(numPhi-1));

  /* create sphere */
  int tri = 0;
  const float rcpNumTheta = rcp((float)numTheta);
  const float rcpNumPhi   = rcp((float)numPhi);
  for (int phi=0; phi<=numPhi; phi++)
  {
    for (int theta=0; theta<numTheta; theta++)
    {
      const float phif   = phi*float(pi)*rcpNumPhi;
      const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;

      Vertex& v = vertices[phi*numTheta+theta];
      v.x = p.x + r*sin(phif)*sin(thetaf);
      v.y = p.y + r*cos(phif);
      v.z = p.z + r*sin(phif)*cos(thetaf);
    }
    if (phi == 0) continue;

    for (int theta=1; theta<=numTheta; theta++)
    {
      int p00 = (phi-1)*numTheta+theta-1;
      int p01 = (phi-1)*numTheta+theta%numTheta;
      int p10 = phi*numTheta+theta-1;
      int p11 = phi*numTheta+theta%numTheta;

      if (phi > 1) {
        triangles[tri].v0 = p10;
        triangles[tri].v1 = p01;
        triangles[tri].v2 = p00;
        tri++;
      }

      if (phi < numPhi) {
        triangles[tri].v0 = p11;
        triangles[tri].v1 = p01;
        triangles[tri].v2 = p10;
        tri++;
      }
    }
  }

  rtcCommitGeometry(geom);
  unsigned int geomID = rtcAttachGeometry(scene,geom);
  rtcReleaseGeometry(geom);
  return geomID;
}